

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolortransform.cpp
# Opt level: O2

void __thiscall
QColorTransformPrivate::applyConvertOut<QCmyk32,unsigned_int>
          (QColorTransformPrivate *this,QCmyk32 *dst,uint *src,QColorVector *buffer,qsizetype len,
          TransformFlags flags)

{
  QColorSpacePrivate *pQVar1;
  variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT> *element;
  variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT> *__variants;
  long lVar2;
  long in_FS_OFFSET;
  anon_class_16_2_4b7f43a0 local_50;
  QColorVector *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->colorSpaceOut).d.ptr;
  __variants = (pQVar1->mBA).d.ptr;
  local_40 = buffer;
  for (lVar2 = (pQVar1->mBA).d.size * 0x1c8; lVar2 != 0; lVar2 = lVar2 + -0x1c8) {
    local_50.buffer = &local_40;
    local_50.len = len;
    std::
    visit<QColorTransformPrivate::applyConvertOut<QCmyk32,unsigned_int>(QCmyk32*,unsigned_int_const*,QColorVector*,long_long,QFlags<QColorTransformPrivate::TransformFlag>)const::_lambda(auto:1&&)_1_,std::variant<QColorSpacePrivate::TransferElement,QColorMatrix,QColorVector,QColorCLUT>const&>
              (&local_50,__variants);
    __variants = __variants + 1;
  }
  clampIfNeeded<(ApplyMatrixForm)1>(local_40,len);
  storeUnpremultipliedLUT<unsigned_int>(dst,src,local_40,len);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorTransformPrivate::applyConvertOut(D *dst, const S *src, QColorVector *buffer, qsizetype len, TransformFlags flags) const
{
    constexpr ApplyMatrixForm doClamp = UnclampedValues<D> ? DoNotClamp : DoClamp;
    if constexpr (IsGrayscale<D>) {
        Q_UNUSED(src); // dealing with buggy warnings in gcc 9
        Q_UNUSED(flags);
        // Calculate the matrix for grayscale conversion
        QColorMatrix grayMatrix;
        if (colorSpaceIn == colorSpaceOut ||
                (colorSpaceIn->colorModel == QColorSpace::ColorModel::Gray &&
                 colorSpaceOut->colorModel == QColorSpace::ColorModel::Gray)) {
            // colorMatrix already has the right form
            grayMatrix = colorMatrix;
        } else {
            if constexpr (IsGrayscale<S>) {
                if (colorSpaceIn->colorModel == QColorSpace::ColorModel::Gray)
                    grayMatrix = colorSpaceIn->chad;
                else
                    grayMatrix = QColorMatrix::identity(); // Otherwise already handled in applyConvertIn
            } else {
                if (colorSpaceIn->isThreeComponentMatrix())
                    grayMatrix = colorSpaceIn->toXyz;
                else
                    grayMatrix = QColorMatrix::identity();
            }
            if (!colorSpaceOut->chad.isNull())
                grayMatrix = colorSpaceOut->chad.inverted() * grayMatrix;
        }

        applyMatrix<doClamp>(buffer, len, grayMatrix);
        storeOpaque(dst, buffer, len, this);
        return;
    } else if constexpr (CanUseThreeComponent<D>) {
        if (colorSpaceOut->isThreeComponentMatrix()) {
            if (IsGrayscale<S> && colorSpaceIn->colorModel != QColorSpace::ColorModel::Gray)
                applyMatrix<doClamp>(buffer, len, colorSpaceOut->toXyz.inverted()); // colorMatrix wasnt prepared for gray input
            else
                applyMatrix<doClamp>(buffer, len, colorMatrix);

            if constexpr (IsAlwaysOpaque<S>) {
                storeOpaque(dst, buffer, len, this);
            } else {
                if (flags & InputOpaque)
                    storeOpaque(dst, buffer, len, this);
                else if (flags & OutputPremultiplied)
                    storePremultiplied(dst, src, buffer, len, this);
                else
                    storeUnpremultiplied(dst, src, buffer, len, this);
            }
            return;
        }
    }
    if constexpr (!IsGrayscale<D>) {
        Q_ASSERT(!colorSpaceOut->isThreeComponentMatrix());

        // Do element based conversion
        for (auto &&element : colorSpaceOut->mBA)
            std::visit([&buffer, len](auto &&elm) { visitElement(elm, buffer, len); }, element);

        clampIfNeeded<doClamp>(buffer, len);

        if (flags & OutputPremultiplied)
            storePremultipliedLUT(dst, src, buffer, len);
        else
            storeUnpremultipliedLUT(dst, src, buffer, len);
    } else {
        Q_UNREACHABLE();
    }
}